

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O2

bool __thiscall COLLADASaxFWL::MeshLoader::loadSourceElement(MeshLoader *this,InputShared *input)

{
  Semantic SVar1;
  bool bVar2;
  MeshLoader *this_00;
  ostream *poVar3;
  String *pSVar4;
  MeshLoader *this_01;
  URI *copyFrom_;
  Semantic SStack_134;
  String SStack_130;
  undefined1 auStack_110 [232];
  
  SVar1 = (input->super_InputUnshared).mSemantic;
  switch(SVar1) {
  case NORMAL:
    bVar2 = loadNormalsSourceElement(this,input);
    return bVar2;
  case OUTPUT:
  case OUT_TANGENT:
  case TANGENT:
    goto switchD_0083c083_caseD_d;
  case POSITION:
    bVar2 = loadPositionsSourceElement(this,input);
    return bVar2;
  case TEXBINORMAL:
    bVar2 = loadTexBinormalSourceElement(this,input);
    return bVar2;
  case TEXCOORD:
  case UV:
    bVar2 = loadTexCoordsSourceElement(this,input);
    return bVar2;
  case TEXTANGENT:
    bVar2 = loadTexTangentSourceElement(this,input);
    return bVar2;
  default:
    if (SVar1 == COLOR) {
      SStack_134 = (input->super_InputUnshared).mSemantic;
      if (SStack_134 == COLOR) {
        copyFrom_ = &(input->super_InputUnshared).mSource;
        COLLADABU::URI::URI((URI *)auStack_110,copyFrom_,false);
        std::__cxx11::string::string((string *)&SStack_130,(string *)(auStack_110 + 0xc0));
        this_00 = (MeshLoader *)
                  SourceArrayLoader::getSourceById(&this->super_SourceArrayLoader,&SStack_130);
        if ((this_00 == (MeshLoader *)0x0) ||
           (this_01 = this_00,
           bVar2 = SourceBase::isLoadedInputElement((SourceBase *)this_00,&SStack_134), bVar2)) {
          bVar2 = false;
        }
        else {
          if ((this_00->super_SourceArrayLoader).mSourceArray.mCount - 5 < 0xfffffffffffffffe) {
            poVar3 = std::operator<<((ostream *)&std::cerr,"The color source ");
            pSVar4 = COLLADABU::URI::getURIString_abi_cxx11_(copyFrom_);
            poVar3 = std::operator<<(poVar3,(string *)pSVar4);
            poVar3 = std::operator<<(poVar3," has a wrong dimension of ");
            poVar3 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar3);
            poVar3 = std::operator<<(poVar3,
                                     ". Dimensions between 3 (RGB) and 4 (RGBA) are allowed. ");
            std::endl<char,std::char_traits<char>>(poVar3);
            bVar2 = false;
          }
          else {
            bVar2 = appendVertexValues(this_01,(SourceBase *)this_00,&this->mMesh->mColors);
          }
          SourceBase::addLoadedInputElement((SourceBase *)this_00,&SStack_134);
        }
        std::__cxx11::string::~string((string *)&SStack_130);
        COLLADABU::URI::~URI((URI *)auStack_110);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "The current input element is not a COLOR element!");
        std::endl<char,std::char_traits<char>>(poVar3);
        bVar2 = false;
      }
      return bVar2;
    }
switchD_0083c083_caseD_d:
    return false;
  }
}

Assistant:

bool MeshLoader::loadSourceElement ( const InputShared& input )
    {
        bool retValue = false;

        // Get the semantic of the current input element.
        InputSemantic::Semantic semantic = input.getSemantic ();
        switch ( semantic )
        {
        case InputSemantic::POSITION:
            retValue = loadPositionsSourceElement ( input );
            break;
        case InputSemantic::NORMAL:
            retValue = loadNormalsSourceElement ( input );
            break;
        case InputSemantic::COLOR:
            retValue = loadColorsSourceElement ( input );
            break;
        case InputSemantic::UV:
        case InputSemantic::TEXCOORD:
            retValue = loadTexCoordsSourceElement ( input );
            break;
        case InputSemantic::TEXTANGENT:
            retValue = loadTexTangentSourceElement( input );
            break;
        case InputSemantic::TEXBINORMAL:
            retValue = loadTexBinormalSourceElement( input );
            break;
        default:
            // Not implemented source
//            std::cerr << "Source with semantic " << semantic << "not implemented!" << std::endl;
            retValue = false;
        }

        return retValue;
    }